

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.cpp
# Opt level: O1

void __thiscall
Js::ConstructorCache::ConstructorCache(ConstructorCache *this,ConstructorCache *other)

{
  byte bVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  
  PropertyGuard::PropertyGuard(&this->super_PropertyGuard,(other->super_PropertyGuard).value);
  (this->content).scriptContext.ptr = (ScriptContext *)0x0;
  (this->content).pendingType.ptr = (DynamicType *)0x0;
  pSVar2 = (other->content).scriptContext.ptr;
  Memory::Recycler::WBSetBit((char *)&this->content);
  (this->content).scriptContext.ptr = pSVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->content);
  (this->content).slotCount = (other->content).slotCount;
  (this->content).inlineSlotCount = (other->content).inlineSlotCount;
  (this->content).updateAfterCtor = (other->content).updateAfterCtor;
  bVar6 = (other->content).field_0x14 & 8;
  bVar1 = (this->content).field_0x14;
  (this->content).field_0x14 = bVar1 & 0xf7 | bVar6;
  bVar7 = (other->content).field_0x14 & 0x10;
  (this->content).field_0x14 = bVar1 & 0xe7 | bVar6 | bVar7;
  bVar8 = (other->content).field_0x14 & 1;
  (this->content).field_0x14 = bVar1 & 0xe6 | bVar6 | bVar7 | bVar8;
  bVar9 = (other->content).field_0x14 & 2;
  (this->content).field_0x14 = bVar1 & 0xe4 | bVar6 | bVar7 | bVar8 | bVar9;
  bVar10 = (other->content).field_0x14 & 4;
  (this->content).field_0x14 = bVar1 & 0xe0 | bVar6 | bVar7 | bVar8 | bVar9 | bVar10;
  bVar11 = (other->content).field_0x14 & 0x20;
  (this->content).field_0x14 = bVar1 & 0xc0 | bVar6 | bVar7 | bVar8 | bVar9 | bVar10 | bVar11;
  (this->content).field_0x14 =
       bVar1 & 0x80 | bVar6 | bVar7 | bVar8 | bVar9 | bVar10 | bVar11 |
       (other->content).field_0x14 & 0x40;
  (this->content).callCount = (other->content).callCount;
  bVar4 = IsConsistent(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x2e,"(IsConsistent())","IsConsistent()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

ConstructorCache::ConstructorCache(ConstructorCache const * other) : PropertyGuard(other->GetValue())
    {
        Assert(other != nullptr);
        this->content.scriptContext = other->content.scriptContext;
        this->content.slotCount = other->content.slotCount;
        this->content.inlineSlotCount = other->content.inlineSlotCount;
        this->content.updateAfterCtor = other->content.updateAfterCtor;
        this->content.ctorHasNoExplicitReturnValue = other->content.ctorHasNoExplicitReturnValue;
        this->content.skipDefaultNewObject = other->content.skipDefaultNewObject;
        this->content.isPopulated = other->content.isPopulated;
        this->content.isPolymorphic = other->content.isPolymorphic;
        this->content.typeUpdatePending = other->content.typeUpdatePending;
        this->content.typeIsFinal = other->content.typeIsFinal;
        this->content.hasPrototypeChanged = other->content.hasPrototypeChanged;
        this->content.callCount = other->content.callCount;
        Assert(IsConsistent());
    }